

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::PartialBlockManager::RegisterPartialBlock
          (PartialBlockManager *this,PartialBlockAllocation *allocation)

{
  unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true> *this_00;
  uint uVar1;
  uint32_t uVar2;
  BlockManager *pBVar3;
  const_iterator __position;
  pointer pPVar4;
  pointer this_01;
  idx_t iVar5;
  idx_t iVar6;
  uint uVar7;
  ulong uVar8;
  type block_to_free;
  pair<unsigned_int,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>
  local_40;
  
  this_00 = &allocation->partial_block;
  pPVar4 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
           operator->(this_00);
  if ((pPVar4->state).block_use_count < this->max_use_count) {
    uVar2 = (pPVar4->state).offset;
    uVar1 = uVar2 + allocation->allocation_size;
    uVar7 = uVar2 + allocation->allocation_size + 7 & 0xfffffff8;
    if (uVar7 != uVar1) {
      this_01 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
                operator->(this_00);
      PartialBlock::AddUninitializedRegion(this_01,(ulong)uVar1,(ulong)uVar7);
    }
    (pPVar4->state).offset = uVar7;
    uVar7 = (pPVar4->state).block_size - uVar7;
    pBVar3 = this->block_manager;
    iVar5 = optional_idx::GetIndex(&pBVar3->block_alloc_size);
    iVar6 = optional_idx::GetIndex(&pBVar3->block_header_size);
    if (iVar5 - (this->max_partial_block_size + iVar6) <= (ulong)uVar7) {
      local_40.first = uVar7;
      local_40.second.
      super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
           (this_00->
           super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)._M_t.
           super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
           .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>).
      _M_t.super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl = (PartialBlock *)0x0;
      ::std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
      ::
      _M_emplace_equal<std::pair<unsigned_int,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
                  *)&this->partially_filled_blocks,&local_40);
      if (local_40.second.
          super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
          super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
          .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
           )0x0) {
        (*(*(_func_int ***)
            local_40.second.
            super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
            super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
            .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl)[1])();
      }
    }
  }
  uVar8 = (ulong)((pPVar4->state).block_size - (pPVar4->state).offset);
  local_40._0_8_ =
       (this_00->super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
       super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)._M_t
  .super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
  super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl = (PartialBlock *)0x0;
  if (((PartialBlock *)local_40._0_8_ == (PartialBlock *)0x0) &&
     (0x80000000 < (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_node_count)
     ) {
    __position._M_node =
         (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40._0_8_ = __position._M_node[1]._M_parent;
    __position._M_node[1]._M_parent = (_Base_ptr)0x0;
    uVar8 = *(ulong *)(__position._M_node + 1);
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>_>
    ::_M_erase_aux(&(this->partially_filled_blocks)._M_t,__position);
  }
  if ((PartialBlock *)local_40._0_8_ != (PartialBlock *)0x0) {
    pPVar4 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
             operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                         *)&local_40);
    (*pPVar4->_vptr_PartialBlock[2])(pPVar4,uVar8);
  }
  if ((PartialBlock *)local_40._0_8_ != (PartialBlock *)0x0) {
    (*(*(_func_int ***)local_40._0_8_)[1])();
  }
  return;
}

Assistant:

void PartialBlockManager::RegisterPartialBlock(PartialBlockAllocation allocation) {
	auto &state = allocation.partial_block->state;
	D_ASSERT(partial_block_type != PartialBlockType::FULL_CHECKPOINT || state.block_id >= 0);
	if (state.block_use_count < max_use_count) {
		auto unaligned_size = allocation.allocation_size + state.offset;
		auto new_size = AlignValue(unaligned_size);
		if (new_size != unaligned_size) {
			// register the uninitialized region so we can correctly initialize it before writing to disk
			allocation.partial_block->AddUninitializedRegion(unaligned_size, new_size);
		}
		state.offset = new_size;
		auto new_space_left = state.block_size - new_size;
		// check if the block is STILL partially filled after adding the segment_size
		if (new_space_left >= block_manager.GetBlockSize() - max_partial_block_size) {
			// the block is still partially filled: add it to the partially_filled_blocks list
			partially_filled_blocks.insert(make_pair(new_space_left, std::move(allocation.partial_block)));
		}
	}
	idx_t free_space = state.block_size - state.offset;
	auto block_to_free = std::move(allocation.partial_block);
	if (!block_to_free && partially_filled_blocks.size() > MAX_BLOCK_MAP_SIZE) {
		// Free the page with the least space free.
		auto itr = partially_filled_blocks.begin();
		block_to_free = std::move(itr->second);
		free_space = itr->first;
		partially_filled_blocks.erase(itr);
	}
	// Flush any block that we're not going to reuse.
	if (block_to_free) {
		block_to_free->Flush(free_space);
	}
}